

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelMappingSparse.cpp
# Opt level: O1

void __thiscall
TransitionModelMappingSparse::TransitionModelMappingSparse
          (TransitionModelMappingSparse *this,int nrS,int nrJA)

{
  pointer *pppcVar1;
  iterator __position;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RAX;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  SparseMatrix *T;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_38;
  
  local_38 = in_RAX;
  TransitionModelDiscrete::TransitionModelDiscrete(&this->super_TransitionModelDiscrete,nrS,nrJA);
  (this->super_TransitionModelDiscrete).super_TransitionModelDiscreteInterface.super_TransitionModel
  ._vptr_TransitionModel = (_func_int **)&PTR__TransitionModelMappingSparse_005e76c0;
  (this->_m_T).
  super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_T).
  super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_T).
  super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (nrJA != 0) {
    do {
      this_00 = (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)operator_new(0x70);
      boost::numeric::ublas::
      compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::compressed_matrix(this_00,(long)nrS,(long)nrS,0);
      __position._M_current =
           (this->_m_T).
           super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = this_00;
      if (__position._M_current ==
          (this->_m_T).
          super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,std::allocator<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*>>
        ::
        _M_realloc_insert<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const&>
                  ((vector<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,std::allocator<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*>>
                    *)&this->_m_T,__position,&local_38);
      }
      else {
        *__position._M_current = this_00;
        pppcVar1 = &(this->_m_T).
                    super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      nrJA = nrJA + -1;
    } while (nrJA != 0);
  }
  return;
}

Assistant:

TransitionModelMappingSparse::TransitionModelMappingSparse(int nrS, int nrJA) :
    TransitionModelDiscrete(nrS, nrJA)
{    
    SparseMatrix *T;
    for(int a=0;a!=nrJA;++a)
    {
        T=new SparseMatrix(nrS,nrS);
        _m_T.push_back(T);
    }
}